

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

void __thiscall icu_63::Package::setItemCapacity(Package *this,int32_t max)

{
  Item *__src;
  Item *__dest;
  UErrorCode *pErrorCode;
  uint8_t *data;
  undefined8 uStack_30;
  
  if (max <= this->itemMax) {
    return;
  }
  data = (uint8_t *)((long)max * 0x18);
  uStack_30 = (code *)0x1e7776;
  __dest = (Item *)uprv_malloc_63((size_t)data);
  if (__dest != (Item *)0x0) {
    __src = this->items;
    if ((__src != (Item *)0x0) && (0 < (long)this->itemCount)) {
      uStack_30 = (code *)0x1e77a9;
      memcpy(__dest,__src,(long)this->itemCount * 0x18);
    }
    this->itemMax = max;
    this->items = __dest;
    uprv_free_63(__src);
    return;
  }
  uStack_30 = getTypeEnumForInputData;
  setItemCapacity();
  getDataInfo(data,max,(int32_t *)((long)&uStack_30 + 4),(int32_t *)&uStack_30,pErrorCode);
  return;
}

Assistant:

void Package::setItemCapacity(int32_t max)
{
  if(max<=itemMax) {
    return;
  }
  Item *newItems = (Item*)uprv_malloc(max * sizeof(items[0]));
  Item *oldItems = items;
  if(newItems == NULL) {
    fprintf(stderr, "icupkg: Out of memory trying to allocate %lu bytes for %d items\n",
        (unsigned long)(max*sizeof(items[0])), max);
    exit(U_MEMORY_ALLOCATION_ERROR);
  }
  if(items && itemCount>0) {
    uprv_memcpy(newItems, items, (size_t)itemCount*sizeof(items[0]));
  }
  itemMax = max;
  items = newItems;
  uprv_free(oldItems);
}